

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverWorstLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  int local_40;
  int fUseFirst;
  int nLitsCur;
  int nLitsMin;
  int iMin;
  int i;
  int nBit;
  int nWord;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMask_local;
  Mvc_Cover_t *pCover_local;
  
  nLitsCur = -1;
  fUseFirst = 1000000;
  for (nLitsMin = 0; nLitsMin < pCover->nBits; nLitsMin = nLitsMin + 1) {
    if ((pMask == (Mvc_Cube_t *)0x0) ||
       ((pMask->pData[nLitsMin >> 5] & 1 << ((byte)nLitsMin & 0x1f)) != 0)) {
      local_40 = 0;
      for (_nBit = (pCover->lCubes).pHead; _nBit != (Mvc_Cube_t *)0x0; _nBit = _nBit->pNext) {
        if ((_nBit->pData[nLitsMin >> 5] & 1 << ((byte)nLitsMin & 0x1f)) != 0) {
          local_40 = local_40 + 1;
        }
      }
      if ((1 < local_40) && (local_40 < fUseFirst)) {
        fUseFirst = local_40;
        nLitsCur = nLitsMin;
      }
    }
  }
  if (fUseFirst < 1000000) {
    pCover_local._4_4_ = nLitsCur;
  }
  else {
    pCover_local._4_4_ = -1;
  }
  return pCover_local._4_4_;
}

Assistant:

int Mvc_CoverWorstLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMin, nLitsMin, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMin = -1;
    nLitsMin = 1000000;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // skip the literal that does not occur or occurs once
            if ( nLitsCur < 2 )
                continue;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMin > nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
            else
            {
                if ( nLitsMin >= nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
        }

    if ( nLitsMin < 1000000 )
        return iMin;
    return -1;
}